

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O2

string * Assimp::BaseImporter::GetExtension(string *__return_storage_ptr__,string *file)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  long lVar4;
  size_type sVar5;
  char cVar6;
  allocator<char> local_11;
  
  lVar4 = std::__cxx11::string::rfind((char)file,0x2e);
  if (lVar4 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_11);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)file);
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar3 = __return_storage_ptr__->_M_string_length;
    for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
      cVar1 = pcVar2[sVar5];
      cVar6 = cVar1 + ' ';
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        cVar6 = cVar1;
      }
      pcVar2[sVar5] = cVar6;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BaseImporter::GetExtension( const std::string& file ) {
    std::string::size_type pos = file.find_last_of('.');

    // no file extension at all
    if (pos == std::string::npos) {
        return "";
    }


    // thanks to Andy Maloney for the hint
    std::string ret = file.substr( pos + 1 );
    std::transform( ret.begin(), ret.end(), ret.begin(), ToLower<char>);

    return ret;
}